

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  cmCTest *pcVar5;
  cmCTestTestProperties *pcVar6;
  char *pcVar7;
  pointer pcVar8;
  cmCTestRunTest *pcVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  ostream *poVar13;
  cmProcess *pcVar14;
  _Base_ptr p_Var15;
  string *psVar16;
  pointer pbVar17;
  double testTimeOut;
  string msg;
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  long *local_1d8;
  long local_1c8 [2];
  cmCTestRunTest *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar12 = 0xe;
  if (total < 100) {
    lVar12 = (ulong)(9 < total) * 2 + 10;
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar12;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start ",6);
  uVar4 = this->TestHandler->MaxIndex;
  lVar12 = 3;
  if (uVar4 < 100) {
    lVar12 = 2 - (ulong)(uVar4 < 10);
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar12;
  poVar13 = (ostream *)std::ostream::operator<<(local_1a8,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,(this->TestProperties->Name)._M_dataplus._M_p,
                       (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  pcVar5 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1aa,local_1f8._M_dataplus._M_p,false);
  paVar3 = &local_1f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  if (this->TestProperties->Disabled == true) {
    (this->TestResult).Properties = this->TestProperties;
    (this->TestResult).ExecutionTime = 0.0;
    (this->TestResult).CompressOutput = false;
    (this->TestResult).ReturnValue = -1;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).CompletionStatus,0,
               (char *)(this->TestResult).CompletionStatus._M_string_length,0x63002b);
    (this->TestResult).Status = 0;
    (this->TestResult).TestCount = this->TestProperties->Index;
    std::__cxx11::string::_M_assign((string *)&this->TestResult);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
    pcVar14 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar14);
    this->TestProcess = pcVar14;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).Output,0,
               (char *)(this->TestResult).Output._M_string_length,0x63002b);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).FullCommandLine,0,
               (char *)(this->TestResult).FullCommandLine._M_string_length,0x66eafa);
    return false;
  }
  ComputeArguments(this);
  pcVar6 = this->TestProperties;
  pcVar7 = (char *)(this->TestResult).CompletionStatus._M_string_length;
  (this->TestResult).Properties = pcVar6;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  psVar1 = &(this->TestResult).CompletionStatus;
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar7,0x633bd6);
  (this->TestResult).Status = 8;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pbVar17 = (pcVar6->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(pcVar6->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17) < 0x21) ||
       (iVar11 = std::__cxx11::string::compare((char *)(pbVar17 + 1)), iVar11 != 0)) {
      pbVar17 = (this->TestProperties->RequiredFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar17 !=
          (this->TestProperties->RequiredFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar8 = (pbVar17->_M_dataplus)._M_p;
          local_1f8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,pcVar8,pcVar8 + pbVar17->_M_string_length);
          bVar10 = cmsys::SystemTools::FileExists(local_1f8._M_dataplus._M_p);
          if (!bVar10) {
            pcVar14 = (cmProcess *)operator_new(0xc0);
            cmProcess::cmProcess(pcVar14);
            this->TestProcess = pcVar14;
            poVar13 = this->TestHandler->LogFile;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"Unable to find required file: ",0x1e);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unable to find required file: ",0x1e);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                                 local_1f8._M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar5 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                         ,0x1fb,(char *)local_1d8,false);
            if (local_1d8 != local_1c8) {
              operator_delete(local_1d8,local_1c8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"Unable to find required file: ",&local_1f8);
            std::__cxx11::string::operator=
                      ((string *)&(this->TestResult).Output,(string *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&(this->TestResult).FullCommandLine,0,
                       (char *)(this->TestResult).FullCommandLine._M_string_length,0x66eafa);
            std::__cxx11::string::_M_replace
                      ((ulong)psVar1,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                       0x633cba);
            goto LAB_003261a9;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1f8._M_dataplus._M_p,
                            CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                     local_1f8.field_2._M_local_buf[0]) + 1);
          }
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 !=
                 (this->TestProperties->RequiredFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar11 = std::__cxx11::string::compare((char *)&this->ActualCommand);
      if (iVar11 == 0) {
        pcVar14 = (cmProcess *)operator_new(0xc0);
        cmProcess::cmProcess(pcVar14);
        this->TestProcess = pcVar14;
        poVar13 = this->TestHandler->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"Unable to find executable: ",0x1b);
        pbVar17 = (pcVar6->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,pbVar17[1]._M_dataplus._M_p,pbVar17[1]._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unable to find executable: ",0x1b);
        pbVar17 = (pcVar6->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pbVar17[1]._M_dataplus._M_p,
                             pbVar17[1]._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar5 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x20b,local_1f8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                   local_1f8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"Unable to find executable: ",
                       (pcVar6->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&(this->TestResult).FullCommandLine,0,
                   (char *)(this->TestResult).FullCommandLine._M_string_length,0x66eafa);
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                   0x633ced);
        (this->TestResult).Status = 0;
        return false;
      }
      cmCTest::CurrentTime_abi_cxx11_((string *)local_1a8,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      testTimeOut = ResolveTimeout(this);
      if (this->StopTimePassed != false) {
        return false;
      }
      bVar10 = ForkProcess(this,testTimeOut,this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
      return bVar10;
    }
    pcVar14 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar14);
    this->TestProcess = pcVar14;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)paVar3;
    psVar16 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
    if (psVar16->_M_string_length == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1f8,0,(char *)local_1f8._M_string_length,0x633c1a);
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1f8,0,(char *)local_1f8._M_string_length,0x633c5f);
      psVar16 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)(psVar16->_M_dataplus)._M_p);
    }
    std::__cxx11::string::append((char *)&local_1f8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (this->TestHandler->LogFile,local_1f8._M_dataplus._M_p,
                         local_1f8._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
    ;
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar5 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1e7,(char *)local_1d8,false);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).FullCommandLine,0,
               (char *)(this->TestResult).FullCommandLine._M_string_length,0x66eafa);
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->TestResult).CompletionStatus._M_string_length,0x633c85
              );
LAB_003261a9:
    (this->TestResult).Status = 0;
  }
  else {
    pcVar14 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar14);
    this->TestProcess = pcVar14;
    local_1f8._M_dataplus._M_p = (pointer)paVar3;
    local_1b0 = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"Failed test dependencies:","");
    p_Var15 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
    local_1b8 = this;
    if ((_Rb_tree_header *)p_Var15 != p_Var2) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var15 + 1));
        std::__cxx11::string::_M_append((char *)&local_1f8,local_1a8._0_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)p_Var15 != p_Var2);
    }
    pcVar9 = local_1b8;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1b8->TestHandler->LogFile,local_1f8._M_dataplus._M_p,
                         local_1f8._M_string_length);
    psVar1 = local_1b0;
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
    ;
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar5 = pcVar9->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1d3,(char *)local_1d8,false);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(pcVar9->TestResult).Output);
    std::__cxx11::string::_M_replace
              ((ulong)&(pcVar9->TestResult).FullCommandLine,0,
               (char *)(pcVar9->TestResult).FullCommandLine._M_string_length,0x66eafa);
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(pcVar9->TestResult).CompletionStatus._M_string_length,
               0x633c00);
    (pcVar9->TestResult).Status = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2 * getNumWidth(total) + 8)
               << "Start "
               << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
               << this->TestProperties->Index << ": "
               << this->TestProperties->Name << std::endl);
  this->ProcessOutput.clear();

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.Properties = this->TestProperties;
    this->TestResult.ExecutionTime = 0;
    this->TestResult.CompressOutput = false;
    this->TestResult.ReturnValue = -1;
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.TestCount = this->TestProperties->Index;
    this->TestResult.Name = this->TestProperties->Name;
    this->TestResult.Path = this->TestProperties->Directory;
    this->TestProcess = new cmProcess;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine = "";
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  if (!this->FailedDependencies.empty()) {
    this->TestProcess = new cmProcess;
    std::string msg = "Failed test dependencies:";
    for (std::set<std::string>::const_iterator it =
           this->FailedDependencies.begin();
         it != this->FailedDependencies.end(); ++it) {
      msg += " " + *it;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    this->TestProcess = new cmProcess;
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
    } else {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::vector<std::string>::iterator i =
         this->TestProperties->RequiredFiles.begin();
       i != this->TestProperties->RequiredFiles.end(); ++i) {
    std::string file = *i;

    if (!cmSystemTools::FileExists(file.c_str())) {
      // Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand == "") {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if (this->StopTimePassed) {
    return false;
  }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}